

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::RequestImpl(CServerBrowser *this,NETADDR *Addr,CServerEntry *pEntry)

{
  CConfig *pCVar1;
  int64 iVar2;
  long in_RDX;
  CServerBrowser *in_RDI;
  long in_FS_OFFSET;
  CSendCBData Data;
  CNetChunk Packet;
  CPacker Packer;
  char aBuf [256];
  char aAddrStr [48];
  int in_stack_fffffffffffff63c;
  undefined4 in_stack_fffffffffffff640;
  int iVar3;
  CServerBrowser *pCallbackData;
  undefined8 in_stack_fffffffffffff668;
  char *in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff67c;
  char local_138 [256];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCallbackData = in_RDI;
  pCVar1 = Config(in_RDI);
  if (pCVar1->m_Debug != 0) {
    net_addr_str((NETADDR *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 in_stack_fffffffffffff670,(int)((ulong)in_stack_fffffffffffff668 >> 0x20),
                 (int)in_stack_fffffffffffff668);
    str_format(local_138,0x100,"requesting server info from %s",local_38);
    (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (in_RDI->m_pConsole,2,"client_srvbrowse",local_138,0);
  }
  CPacker::Reset((CPacker *)&stack0xfffffffffffff6b0);
  CPacker::AddRaw((CPacker *)&stack0xfffffffffffff6b0,SERVERBROWSE_GETINFO,8);
  if (in_RDX == 0) {
    iVar3 = in_RDI->m_CurrentLanToken;
  }
  else {
    iVar3 = *(int *)(in_RDX + 0x24);
  }
  CPacker::AddInt((CPacker *)CONCAT44(iVar3,in_stack_fffffffffffff640),in_stack_fffffffffffff63c);
  CPacker::Size((CPacker *)&stack0xfffffffffffff6b0);
  CPacker::Data((CPacker *)&stack0xfffffffffffff6b0);
  CNetClient::Send((CNetClient *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (CNetChunk *)in_RDI,0,(CSendCBData *)pCallbackData);
  if (in_RDX != 0) {
    *(undefined4 *)(in_RDX + 0x28) = in_stack_fffffffffffff678;
    iVar2 = time_get();
    *(int64 *)(in_RDX + 0x18) = iVar2;
    *(undefined4 *)(in_RDX + 0x20) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::RequestImpl(const NETADDR &Addr, CServerEntry *pEntry)
{
	if(Config()->m_Debug)
	{
		char aAddrStr[NETADDR_MAXSTRSIZE];
		net_addr_str(&Addr, aAddrStr, sizeof(aAddrStr), true);
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf),"requesting server info from %s", aAddrStr);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", aBuf);
	}

	CPacker Packer;
	Packer.Reset();
	Packer.AddRaw(SERVERBROWSE_GETINFO, sizeof(SERVERBROWSE_GETINFO));
	Packer.AddInt(pEntry ? pEntry->m_CurrentToken : m_CurrentLanToken);

	CNetChunk Packet;
	Packet.m_ClientID = -1;
	Packet.m_Address = Addr;
	Packet.m_Flags = NETSENDFLAG_CONNLESS;
	Packet.m_DataSize = Packer.Size();
	Packet.m_pData = Packer.Data();
	CSendCBData Data;
	Data.m_pfnCallback = CBFTrackPacket;
	Data.m_pCallbackUser = this;
	m_pNetClient->Send(&Packet, NET_TOKEN_NONE, &Data);

	if(pEntry)
	{
		pEntry->m_TrackID = Data.m_TrackID;
		pEntry->m_RequestTime = time_get();
		pEntry->m_InfoState = CServerEntry::STATE_PENDING;
	}
}